

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

void nk_font_atlas_clear(nk_font_atlas *atlas)

{
  nk_font *pnVar1;
  nk_font *pnVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (atlas == (nk_font_atlas *)0x0) {
    __assert_fail("atlas",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bcd,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).alloc == (nk_plugin_alloc)0x0) {
    __assert_fail("atlas->temporary.alloc",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bce,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->temporary).free == (nk_plugin_free)0x0) {
    __assert_fail("atlas->temporary.free",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x2bcf,"void nk_font_atlas_clear(struct nk_font_atlas *)");
  }
  if ((atlas->permanent).alloc != (nk_plugin_alloc)0x0) {
    if ((atlas->permanent).free == (nk_plugin_free)0x0) {
      __assert_fail("atlas->permanent.free",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x2bd1,"void nk_font_atlas_clear(struct nk_font_atlas *)");
    }
    nk_font_atlas_cleanup(atlas);
    pnVar2 = atlas->fonts;
    if (atlas->fonts != (nk_font *)0x0) {
      do {
        pnVar1 = pnVar2->next;
        (*(atlas->permanent).free)((atlas->permanent).userdata,pnVar2);
        pnVar2 = pnVar1;
      } while (pnVar1 != (nk_font *)0x0);
      atlas->fonts = (nk_font *)0x0;
    }
    if (atlas->glyphs != (nk_font_glyph *)0x0) {
      (*(atlas->permanent).free)((atlas->permanent).userdata,atlas->glyphs);
    }
    uVar3 = (ulong)atlas & 3;
    if (uVar3 == 0) {
      uVar4 = 400;
    }
    else {
      memset(atlas,0,4 - uVar3);
      uVar4 = uVar3 | 0x18c;
      atlas = (nk_font_atlas *)((long)atlas + (4 - uVar3));
    }
    uVar3 = (ulong)((uint)uVar4 & 0xfffffffc);
    memset(atlas,0,uVar3);
    if ((uVar4 & 3) != 0) {
      memset((void *)((long)(&atlas->cursors[0].img + -3) + uVar3),0,uVar4 & 3);
      return;
    }
    return;
  }
  __assert_fail("atlas->permanent.alloc",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x2bd0,"void nk_font_atlas_clear(struct nk_font_atlas *)");
}

Assistant:

NK_API void
nk_font_atlas_clear(struct nk_font_atlas *atlas)
{
    NK_ASSERT(atlas);
    NK_ASSERT(atlas->temporary.alloc);
    NK_ASSERT(atlas->temporary.free);
    NK_ASSERT(atlas->permanent.alloc);
    NK_ASSERT(atlas->permanent.free);
    if (!atlas || !atlas->permanent.alloc || !atlas->permanent.free) return;

    nk_font_atlas_cleanup(atlas);
    if (atlas->fonts) {
        struct nk_font *iter, *next;
        for (iter = atlas->fonts; iter; iter = next) {
            next = iter->next;
            atlas->permanent.free(atlas->permanent.userdata, iter);
        }
        atlas->fonts = 0;
    }
    if (atlas->glyphs)
        atlas->permanent.free(atlas->permanent.userdata, atlas->glyphs);
    nk_zero_struct(*atlas);
}